

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::CheckRuleHashes(cmGlobalGenerator *this)

{
  cmake *this_00;
  string *psVar1;
  undefined1 local_50 [8];
  string pfile;
  string home;
  cmGlobalGenerator *this_local;
  
  this_00 = GetCMakeInstance(this);
  psVar1 = cmake::GetHomeOutputDirectory_abi_cxx11_(this_00);
  std::__cxx11::string::string((string *)(pfile.field_2._M_local_buf + 8),(string *)psVar1);
  cmStrCat<std::__cxx11::string&,char_const(&)[32]>
            ((string *)local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (pfile.field_2._M_local_buf + 8),(char (*) [32])"/CMakeFiles/CMakeRuleHashes.txt");
  CheckRuleHashes(this,(string *)local_50,(string *)((long)&pfile.field_2 + 8));
  WriteRuleHashes(this,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(pfile.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmGlobalGenerator::CheckRuleHashes()
{
  std::string home = this->GetCMakeInstance()->GetHomeOutputDirectory();
  std::string pfile = cmStrCat(home, "/CMakeFiles/CMakeRuleHashes.txt");
  this->CheckRuleHashes(pfile, home);
  this->WriteRuleHashes(pfile);
}